

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nike.cpp
# Opt level: O0

void __thiscall NikeShoes::Show(NikeShoes *this)

{
  ostream *poVar1;
  NikeShoes *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_83c7);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(this->super_Shoes).param_.size);
  poVar1 = std::operator<<(poVar1,anon_var_dwarf_2a50);
  poVar1 = std::operator<<(poVar1,(string *)&(this->super_Shoes).param_);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void NikeShoes::Show() {
    std::cout << "耐克球鞋, 大小："<<this->param_.size<<", 颜色："<<this->param_.color<<std::endl;
}